

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  pointer pcVar1;
  pthread_mutex_t *__mutex;
  AppendFile *this_00;
  pointer *__ptr;
  
  (this->basename_)._M_dataplus._M_p = (pointer)&(this->basename_).field_2;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + basename->_M_string_length);
  this->flushEveryN_ = flushEveryN;
  this->count_ = 0;
  __mutex = (pthread_mutex_t *)operator_new(0x28);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>._M_t.
  super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
  super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl = (MutexLock *)__mutex;
  (this->file_)._M_t.super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
  super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
  super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl = (AppendFile *)0x0;
  this_00 = (AppendFile *)operator_new(0x10008);
  AppendFile::AppendFile(this_00,basename);
  std::__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>::reset
            ((__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_> *)&this->file_,this_00);
  return;
}

Assistant:

LogFile::LogFile(const string& basename, int flushEveryN)
        :basename_(basename),
        flushEveryN_(flushEveryN),
        count_(0),
        mutex_(new MutexLock()) {
            file_.reset(new AppendFile(basename));
}